

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeArrayGet<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool signed_)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  Result<wasm::Ok> _val;
  Result<wasm::Ok> type;
  bool signed__local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  typeidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)__return_storage_ptr___00,ctx);
  Result<wasm::Ok>::Result
            ((Result<wasm::Ok> *)local_80,(Result<wasm::Ok> *)__return_storage_ptr___00);
  local_98 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_80);
  bVar1 = local_98 == (Err *)0x0;
  if (!bVar1) {
    wasm::Err::Err(&local_b8,local_98);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
    wasm::Err::~Err(&local_b8);
  }
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_80);
  if (bVar1) {
    Result<wasm::Ok>::operator*
              ((Result<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    NullInstrParserCtx::makeArrayGet<wasm::Ok>
              (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,annotations,signed_);
  }
  Result<wasm::Ok>::~Result
            ((Result<wasm::Ok> *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeArrayGet(Ctx& ctx,
                      Index pos,
                      const std::vector<Annotation>& annotations,
                      bool signed_) {
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  return ctx.makeArrayGet(pos, annotations, *type, signed_);
}